

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

void __thiscall QToolButton::mouseReleaseEvent(QToolButton *this,QMouseEvent *e)

{
  byte *pbVar1;
  long lVar2;
  int *piVar3;
  
  lVar2 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  piVar3 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  QAbstractButton::mouseReleaseEvent(&this->super_QAbstractButton,e);
  if (piVar3 != (int *)0x0) {
    if (piVar3[1] != 0) {
      pbVar1 = (byte *)(lVar2 + 0x2ec);
      *pbVar1 = *pbVar1 & 0xfc;
    }
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
      return;
    }
  }
  return;
}

Assistant:

void QToolButton::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QToolButton);
    QPointer<QAbstractButton> guard(this);
    QAbstractButton::mouseReleaseEvent(e);
    if (guard)
        d->buttonPressed = QToolButtonPrivate::NoButtonPressed;
}